

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logic_program_types.cpp
# Opt level: O0

uint32 __thiscall
Clasp::Asp::RuleTransform::Impl::addRule(Impl *this,Atom_t head,bool add,uint32 bIdx,weight_t bound)

{
  int iVar1;
  size_type sVar2;
  Atom_t a;
  reference pWVar3;
  reference plVar4;
  pod_vector<int,_std::allocator<int>_> *c;
  size_type in_ECX;
  byte in_DL;
  Atom_t in_ESI;
  long in_RDI;
  int in_R8D;
  wsum_t maxW;
  weight_t minW;
  int in_stack_ffffffffffffff48;
  int in_stack_ffffffffffffff4c;
  pod_vector<int,_std::allocator<int>_> *in_stack_ffffffffffffff50;
  undefined4 in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff5c;
  LitSpan *in_stack_ffffffffffffff60;
  Atom_t in_stack_ffffffffffffff6c;
  Impl *in_stack_ffffffffffffff70;
  weight_t in_stack_ffffffffffffff78;
  uint32 in_stack_ffffffffffffff7c;
  size_type sVar5;
  Impl *in_stack_ffffffffffffff80;
  size_type local_1c;
  uint32 local_4;
  
  pWVar3 = bk_lib::pod_vector<Potassco::WeightLit_t,_std::allocator<Potassco::WeightLit_t>_>::back
                     ((pod_vector<Potassco::WeightLit_t,_std::allocator<Potassco::WeightLit_t>_> *)
                      (in_RDI + 0x20));
  iVar1 = pWVar3->weight;
  plVar4 = bk_lib::pod_vector<long,_std::allocator<long>_>::operator[]
                     ((pod_vector<long,_std::allocator<long>_> *)(in_RDI + 0x30),in_ECX + 1);
  if (in_R8D < 1) {
    bk_lib::pod_vector<Potassco::WeightLit_t,_std::allocator<Potassco::WeightLit_t>_>::operator[]
              ((pod_vector<Potassco::WeightLit_t,_std::allocator<Potassco::WeightLit_t>_> *)
               (in_RDI + 0x20),in_ECX);
    bk_lib::pod_vector<int,_std::allocator<int>_>::assign<int>
              (in_stack_ffffffffffffff50,in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48);
    Potassco::toSpan<bk_lib::pod_vector<int,std::allocator<int>>>(in_stack_ffffffffffffff50);
    local_4 = addRule(in_stack_ffffffffffffff70,in_stack_ffffffffffffff6c,in_stack_ffffffffffffff60)
    ;
  }
  else if (*plVar4 - (long)iVar1 < (long)in_R8D) {
    local_1c = ((in_DL & 1 ^ 0xff) & 1) + in_ECX;
    if (*plVar4 < (long)in_R8D) {
      local_4 = 0;
    }
    else {
      bk_lib::pod_vector<int,_std::allocator<int>_>::clear
                ((pod_vector<int,_std::allocator<int>_> *)(in_RDI + 0x10));
      while( true ) {
        sVar5 = local_1c;
        sVar2 = bk_lib::pod_vector<Potassco::WeightLit_t,_std::allocator<Potassco::WeightLit_t>_>::
                size((pod_vector<Potassco::WeightLit_t,_std::allocator<Potassco::WeightLit_t>_> *)
                     (in_RDI + 0x20));
        if (sVar5 == sVar2) break;
        in_stack_ffffffffffffff70 = (Impl *)(in_RDI + 0x10);
        bk_lib::pod_vector<Potassco::WeightLit_t,_std::allocator<Potassco::WeightLit_t>_>::
        operator[]((pod_vector<Potassco::WeightLit_t,_std::allocator<Potassco::WeightLit_t>_> *)
                   (in_RDI + 0x20),local_1c);
        bk_lib::pod_vector<int,_std::allocator<int>_>::push_back
                  ((pod_vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffff60,
                   (int *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
        local_1c = local_1c + 1;
      }
      Potassco::toSpan<bk_lib::pod_vector<int,std::allocator<int>>>(in_stack_ffffffffffffff50);
      local_4 = addRule(in_stack_ffffffffffffff70,in_ESI,in_stack_ffffffffffffff60);
    }
  }
  else {
    bk_lib::pod_vector<int,_std::allocator<int>_>::clear
              ((pod_vector<int,_std::allocator<int>_> *)(in_RDI + 0x10));
    if ((in_DL & 1) != 0) {
      in_stack_ffffffffffffff60 = (LitSpan *)(in_RDI + 0x10);
      bk_lib::pod_vector<Potassco::WeightLit_t,_std::allocator<Potassco::WeightLit_t>_>::operator[]
                ((pod_vector<Potassco::WeightLit_t,_std::allocator<Potassco::WeightLit_t>_> *)
                 (in_RDI + 0x20),in_ECX);
      bk_lib::pod_vector<int,_std::allocator<int>_>::push_back
                ((pod_vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffff60,
                 (int *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
    }
    c = (pod_vector<int,_std::allocator<int>_> *)(in_RDI + 0x10);
    a = getAuxVar(in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78);
    Potassco::lit(a);
    bk_lib::pod_vector<int,_std::allocator<int>_>::push_back
              ((pod_vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffff60,
               (int *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
    Potassco::toSpan<bk_lib::pod_vector<int,std::allocator<int>>>(c);
    local_4 = addRule(in_stack_ffffffffffffff70,in_stack_ffffffffffffff6c,in_stack_ffffffffffffff60)
    ;
  }
  return local_4;
}

Assistant:

uint32 RuleTransform::Impl::addRule(Atom_t head, bool add, uint32 bIdx, weight_t bound) {
	const weight_t minW = agg_.back().weight;
	const wsum_t   maxW = sumR_[bIdx + 1];
	if (bound <= 0) {
		assert(add);
		lits_.assign(1, agg_[bIdx].lit);
		return addRule(head, Potassco::toSpan(lits_));
	}
	if ((maxW - minW) < bound) {
		// remaining literals are all needed to satisfy bound
		bIdx += static_cast<uint32>(!add);
		if (maxW >= bound) {
			lits_.clear();
			for (; bIdx != agg_.size(); ++bIdx) { lits_.push_back(agg_[bIdx].lit); }
			return addRule(head, Potassco::toSpan(lits_));
		}
		return 0;
	}
	lits_.clear();
	if (add) { lits_.push_back(agg_[bIdx].lit); }
	lits_.push_back(Potassco::lit(getAuxVar(bIdx + 1, bound)));
	return addRule(head, Potassco::toSpan(lits_));
}